

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

ptls_aead_context_t *
create_ech_opener(ptls_ech_create_opener_t *self,ptls_hpke_kem_t **kem,
                 ptls_hpke_cipher_suite_t **cipher,ptls_t *tls,uint8_t config_id,
                 ptls_hpke_cipher_suite_id_t cipher_id,ptls_iovec_t enc,ptls_iovec_t info_prefix)

{
  ptls_hpke_cipher_suite_t *cipher_00;
  ptls_key_exchange_context_t *keyex;
  int iVar1;
  ptls_iovec_t info;
  undefined1 auStack_70 [4];
  int ret;
  ptls_buffer_t infobuf;
  ptls_aead_context_t *aead;
  size_t i;
  uint8_t config_id_local;
  ptls_t *tls_local;
  ptls_hpke_cipher_suite_t **cipher_local;
  ptls_hpke_kem_t **kem_local;
  ptls_ech_create_opener_t *self_local;
  ptls_aead_context_t *ppStack_10;
  ptls_hpke_cipher_suite_id_t cipher_id_local;
  
  if ((create_ech_opener::pem == (ptls_key_exchange_context_t *)0x0) &&
     (create_ech_opener::pem =
           key_from_pem(
                       "-----BEGIN PRIVATE KEY-----\nMIGHAgEAMBMGByqGSM49AgEGCCqGSM49AwEHBG0wawIBAQQg885/2uV+GjENh/Hr\nvebzKL4Kmc28rfTWWJzyneS4/9KhRANCAAT+jBnOCQUZHrwpipJFeSUx8m8M7OJG\nBjnovDnLf3Bqgmp3m0z5abig5TnH9i+z0wrWqo+A4w8dEoqv1oos5y6g\n-----END PRIVATE KEY-----\n"
                       ), create_ech_opener::pem == (ptls_key_exchange_context_t *)0x0)) {
    __assert_fail("pem != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/openssl.c",
                  0x15d,
                  "ptls_aead_context_t *create_ech_opener(ptls_ech_create_opener_t *, ptls_hpke_kem_t **, ptls_hpke_cipher_suite_t **, ptls_t *, uint8_t, ptls_hpke_cipher_suite_id_t, ptls_iovec_t, ptls_iovec_t)"
                 );
  }
  *cipher = (ptls_hpke_cipher_suite_t *)0x0;
  aead = (ptls_aead_context_t *)0x0;
  do {
    if (ptls_openssl_hpke_cipher_suites[(long)aead] == (ptls_hpke_cipher_suite_t *)0x0) {
LAB_00157237:
      if (*cipher == (ptls_hpke_cipher_suite_t *)0x0) {
        ppStack_10 = (ptls_aead_context_t *)0x0;
      }
      else {
        infobuf.is_allocated = '\0';
        infobuf.align_bits = '\0';
        infobuf._26_6_ = 0;
        ptls_buffer_init((ptls_buffer_t *)auStack_70,"",0);
        iVar1 = ptls_buffer__do_pushv((ptls_buffer_t *)auStack_70,info_prefix.base,info_prefix.len);
        if ((iVar1 == 0) &&
           (iVar1 = ptls_buffer__do_pushv((ptls_buffer_t *)auStack_70,(char *)0x160d92,99),
           keyex = create_ech_opener::pem, iVar1 == 0)) {
          cipher_00 = *cipher;
          info = ptls_iovec_init(_auStack_70,infobuf.capacity);
          ptls_hpke_setup_base_r
                    (&ptls_openssl_hpke_kem_p256sha256,cipher_00,keyex,
                     (ptls_aead_context_t **)&infobuf.is_allocated,enc,info);
        }
        ptls_buffer_dispose((ptls_buffer_t *)auStack_70);
        ppStack_10 = (ptls_aead_context_t *)infobuf._24_8_;
      }
      return ppStack_10;
    }
    self_local._4_2_ = cipher_id.kdf;
    if (((ptls_openssl_hpke_cipher_suites[(long)aead]->id).kdf == self_local._4_2_) &&
       (self_local._6_2_ = cipher_id.aead,
       (ptls_openssl_hpke_cipher_suites[(long)aead]->id).aead == self_local._6_2_)) {
      *cipher = ptls_openssl_hpke_cipher_suites[(long)aead];
      goto LAB_00157237;
    }
    aead = (ptls_aead_context_t *)((long)&aead->algo + 1);
  } while( true );
}

Assistant:

static ptls_aead_context_t *create_ech_opener(ptls_ech_create_opener_t *self, ptls_hpke_kem_t **kem,
                                              ptls_hpke_cipher_suite_t **cipher, ptls_t *tls, uint8_t config_id,
                                              ptls_hpke_cipher_suite_id_t cipher_id, ptls_iovec_t enc, ptls_iovec_t info_prefix)
{
    static ptls_key_exchange_context_t *pem = NULL;
    if (pem == NULL) {
        pem = key_from_pem(ECH_PRIVATE_KEY);
        assert(pem != NULL);
    }

    *cipher = NULL;
    for (size_t i = 0; ptls_openssl_hpke_cipher_suites[i] != NULL; ++i) {
        if (ptls_openssl_hpke_cipher_suites[i]->id.kdf == cipher_id.kdf &&
            ptls_openssl_hpke_cipher_suites[i]->id.aead == cipher_id.aead) {
            *cipher = ptls_openssl_hpke_cipher_suites[i];
            break;
        }
    }
    if (*cipher == NULL)
        return NULL;

    ptls_aead_context_t *aead = NULL;
    ptls_buffer_t infobuf;
    int ret;

    ptls_buffer_init(&infobuf, "", 0);
    ptls_buffer_pushv(&infobuf, info_prefix.base, info_prefix.len);
    ptls_buffer_pushv(&infobuf, (const uint8_t *)ECH_CONFIG_LIST + 2,
                      sizeof(ECH_CONFIG_LIST) - 3); /* choose the only ECHConfig from the list */
    ret = ptls_hpke_setup_base_r(&ptls_openssl_hpke_kem_p256sha256, *cipher, pem, &aead, enc,
                                 ptls_iovec_init(infobuf.base, infobuf.off));

Exit:
    ptls_buffer_dispose(&infobuf);
    return aead;
}